

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O1

ssize_t __thiscall QBmpHandler::write(QBmpHandler *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  QImageData *pQVar2;
  bool bVar3;
  Format FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QIODevice *pQVar9;
  QDataStream *pQVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint bpl;
  undefined4 in_register_00000034;
  QImage *this_00;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  QImageData *local_88;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [10];
  short sStack_4e;
  int iStack_4c;
  QImageData *local_48;
  long local_38;
  
  this_00 = (QImage *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_98);
  FVar4 = QImage::format(this_00);
  if (FVar4 < Format_RGBX64) {
    if ((0x3aU >> (FVar4 & Format_RGBA16FPx4) & 1) != 0) {
      QImage::operator=((QImage *)local_98,this_00);
      goto LAB_0026df04;
    }
    if ((0x1800000U >> (FVar4 & Format_RGBA16FPx4) & 1) == 0) {
      if (FVar4 != Format_MonoLSB) goto LAB_0026de82;
      FVar4 = Format_Mono;
    }
    else {
      FVar4 = Format_Indexed8;
    }
  }
  else {
LAB_0026de82:
    bVar3 = QImage::hasAlphaChannel(this_00);
    if (bVar3) {
      FVar4 = Format_ARGB32;
    }
    else {
      FVar4 = Format_RGB32;
    }
  }
  QImage::convertToFormat_helper((QImage *)local_58,this_00,FVar4,(ImageConversionFlags)0x0);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
  pQVar2 = local_48;
  local_68 = local_88;
  local_78._0_8_ = &PTR__QImage_007e2f38;
  local_48 = (QImageData *)0x0;
  local_88 = pQVar2;
  QImage::~QImage((QImage *)local_78);
  QImage::~QImage((QImage *)local_58);
LAB_0026df04:
  iVar5 = QImage::width((QImage *)local_98);
  iVar6 = QImage::depth((QImage *)local_98);
  iVar6 = iVar6 * iVar5 + 0x1f;
  bpl = iVar6 >> 3 & 0xfffffffc;
  uVar11 = (ulong)(int)bpl;
  iVar5 = QImage::depth((QImage *)local_98);
  if ((iVar5 == 8) && (iVar5 = QImage::colorCount((QImage *)local_98), iVar5 < 0x11)) {
    lVar12 = (long)((int)((bpl | 1) - (iVar6 >> 0x1f)) >> 1);
    uVar1 = lVar12 + 3;
    uVar11 = lVar12 + 6;
    if (-1 < (long)uVar1) {
      uVar11 = uVar1;
    }
    uVar11 = uVar11 & 0xfffffffffffffffc;
    iVar5 = 4;
  }
  else {
    iVar5 = QImage::depth((QImage *)local_98);
    if (iVar5 == 0x20) {
      iVar5 = QImage::width((QImage *)local_98);
      iVar6 = iVar5 * 0x18 + 0x1f;
      iVar5 = iVar5 * 0x18 + 0x3e;
      if (-1 < iVar6) {
        iVar5 = iVar6;
      }
      uVar11 = (ulong)((iVar5 >> 5) << 2);
      iVar5 = 0x18;
    }
    else {
      iVar5 = QImage::depth((QImage *)local_98);
    }
  }
  iVar6 = (int)uVar11;
  if (this->m_format == DibFormat) {
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = QImageIOHandler::device(&this->super_QImageIOHandler);
    QDataStream::QDataStream((QDataStream *)local_78,pQVar9);
    QDataStream::setByteOrder((ByteOrder)(QDataStream *)local_78);
    bVar3 = qt_write_dib((QDataStream *)local_78,this_00,bpl,iVar6,iVar5);
    uVar11 = CONCAT71(extraout_var_00,bVar3) & 0xffffffff;
  }
  else {
    pQVar9 = QImageIOHandler::device(&this->super_QImageIOHandler);
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)local_78,pQVar9);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::setByteOrder((ByteOrder)(QDataStream *)local_78);
    local_58._0_2_ = 0x4d42;
    stack0xffffffffffffffb0 = (undefined1 *)((ulong)stack0xffffffffffffffb0 & 0xffffffff00000000);
    iVar7 = QImage::colorCount((QImage *)local_98);
    iStack_4c = iVar7 * 4 + 0x36;
    iVar8 = QImage::height((QImage *)local_98);
    iVar7 = iVar8 * iVar6 + iVar7 * 4 + 0x36;
    local_58._4_4_ = iVar7;
    lVar12 = (long)iStack_4c;
    iVar8 = QImage::height((QImage *)local_98);
    if (uVar11 * (long)iVar8 + lVar12 == (long)iVar7) {
      QDataStream::writeRawData((char *)local_78,(longlong)local_58);
      pQVar10 = (QDataStream *)QDataStream::operator<<((QDataStream *)local_78,local_58._4_4_);
      pQVar10 = (QDataStream *)QDataStream::operator<<(pQVar10,local_58._8_2_);
      pQVar10 = (QDataStream *)QDataStream::operator<<(pQVar10,sStack_4e);
      QDataStream::operator<<(pQVar10,iStack_4c);
      bVar3 = qt_write_dib((QDataStream *)local_78,(QImage *)local_98,bpl,iVar6,iVar5);
      uVar11 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
    }
    else {
      uVar11 = 0;
    }
  }
  QDataStream::~QDataStream((QDataStream *)local_78);
  QImage::~QImage((QImage *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::write(const QImage &img)
{
    QImage image;
    switch (img.format()) {
    case QImage::Format_Mono:
    case QImage::Format_Indexed8:
    case QImage::Format_RGB32:
    case QImage::Format_ARGB32:
        image = img;
        break;
    case QImage::Format_MonoLSB:
        image = img.convertToFormat(QImage::Format_Mono);
        break;
    case QImage::Format_Alpha8:
    case QImage::Format_Grayscale8:
        image = img.convertToFormat(QImage::Format_Indexed8);
        break;
    default:
        if (img.hasAlphaChannel())
            image = img.convertToFormat(QImage::Format_ARGB32);
        else
            image = img.convertToFormat(QImage::Format_RGB32);
        break;
    }

    int nbits;
    qsizetype bpl_bmp;
    // Calculate a minimum bytes-per-line instead of using whatever value this QImage is using internally.
    qsizetype bpl = ((image.width() * image.depth() + 31) >> 5) << 2;

    if (image.depth() == 8 && image.colorCount() <= 16) {
        bpl_bmp = (((bpl+1)/2+3)/4)*4;
        nbits = 4;
   } else if (image.depth() == 32) {
        bpl_bmp = ((image.width()*24+31)/32)*4;
        nbits = 24;
    } else {
        bpl_bmp = bpl;
        nbits = image.depth();
    }
    if (qsizetype(int(bpl_bmp)) != bpl_bmp)
        return false;

    if (m_format == DibFormat) {
        QDataStream dibStream(device());
        dibStream.setByteOrder(QDataStream::LittleEndian); // Intel byte order
        return qt_write_dib(dibStream, img, bpl, bpl_bmp, nbits);
    }

    QIODevice *d = device();
    QDataStream s(d);
    BMP_FILEHDR bf;

    // Intel byte order
    s.setByteOrder(QDataStream::LittleEndian);

    // build file header
    memcpy(bf.bfType, "BM", 2);

    // write file header
    bf.bfReserved1 = 0;
    bf.bfReserved2 = 0;
    bf.bfOffBits = BMP_FILEHDR_SIZE + BMP_WIN + image.colorCount() * 4;
    bf.bfSize = bf.bfOffBits + bpl_bmp*image.height();
    if (qsizetype(bf.bfSize) != bf.bfOffBits + bpl_bmp*image.height())
        return false;
    s << bf;

    // write image
    return qt_write_dib(s, image, bpl, bpl_bmp, nbits);
}